

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  long lVar1;
  u8 i;
  long lVar2;
  SR result;
  Simd<long,_(unsigned_char)__x02_> lhs;
  Simd<long,_(unsigned_char)__x02_> rhs;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_28.v128_.v = (v128)Pop(this);
  local_38.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    lVar1 = (*f)(*(long *)((long)&local_38 + lVar2 * 8),*(long *)((long)&local_28 + lVar2 * 8));
    *(long *)((long)&local_48 + lVar2 * 8) = lVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}